

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

bool __thiscall TcpServerImpl::Start(TcpServerImpl *this,char *szIpAddr,uint16_t sPort)

{
  bool bVar1;
  int iVar2;
  char *__service;
  int *piVar3;
  int *piVar4;
  reference piVar5;
  TcpServerImpl *pTStack_e8;
  int iSocketErr;
  code *local_e0;
  undefined8 local_d8;
  thread local_d0;
  int local_c4;
  iterator iStack_c0;
  int fSock;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  uint32_t on;
  int32_t fd;
  addrinfo *curAddr;
  bool bRet;
  string local_88;
  undefined1 auStack_68 [8];
  addrinfo hint;
  addrinfo *local_30;
  addrinfo *lstAddr;
  char *pcStack_20;
  uint16_t sPort_local;
  char *szIpAddr_local;
  TcpServerImpl *this_local;
  
  local_30 = (addrinfo *)0x0;
  hint.ai_addr = (sockaddr *)0x0;
  hint.ai_canonname = (char *)0x0;
  hint.ai_socktype = 0;
  hint.ai_protocol = 0;
  hint.ai_addrlen = 0;
  hint._20_4_ = 0;
  hint.ai_flags = 1;
  hint.ai_family = 0;
  auStack_68._0_4_ = 1;
  auStack_68._4_4_ = 0;
  lstAddr._6_2_ = sPort;
  pcStack_20 = szIpAddr;
  szIpAddr_local = (char *)this;
  std::__cxx11::to_string(&local_88,(uint)sPort);
  __service = (char *)std::__cxx11::string::c_str();
  iVar2 = getaddrinfo(szIpAddr,__service,(addrinfo *)auStack_68,&local_30);
  std::__cxx11::string::~string((string *)&local_88);
  if (iVar2 == 0) {
    curAddr._3_1_ = 1;
    for (_on = local_30; _on != (addrinfo *)0x0; _on = _on->ai_next) {
      __range1._4_4_ = socket(_on->ai_family,_on->ai_socktype,_on->ai_protocol);
      if (__range1._4_4_ == -1) {
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->m_vSock,(value_type_conflict1 *)((long)&__range1 + 4));
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])(this,(long)&__range1 + 4);
      if (_on->ai_family == 10) {
        __range1._0_4_ = 1;
        iVar2 = setsockopt(__range1._4_4_,0x29,0x1a,&__range1,4);
        if (iVar2 == -1) {
          piVar3 = (int *)__cxa_allocate_exception(4);
          piVar4 = __errno_location();
          *piVar3 = *piVar4;
          __cxa_throw(piVar3,&int::typeinfo,0);
        }
      }
      iVar2 = bind(__range1._4_4_,_on->ai_addr,_on->ai_addrlen);
      if (iVar2 < 0) {
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
    }
    __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->m_vSock);
    iStack_c0 = std::vector<int,_std::allocator<int>_>::end(&this->m_vSock);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff40), bVar1) {
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end1);
      local_c4 = *piVar5;
      iVar2 = listen(local_c4,0x1000);
      if (iVar2 < 0) {
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1);
    }
    (this->super_BaseSocketImpl).m_bStop = false;
    local_e0 = SelectThread;
    local_d8 = 0;
    pTStack_e8 = this;
    std::thread::thread<void(TcpServerImpl::*)(),TcpServerImpl*,void>
              (&local_d0,(type *)&local_e0,&stack0xffffffffffffff18);
    std::thread::operator=(&(this->super_BaseSocketImpl).m_thListen,&local_d0);
    std::thread::~thread(&local_d0);
    freeaddrinfo(local_30);
    this_local._7_1_ = (bool)(curAddr._3_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TcpServerImpl::Start(const char* const szIpAddr, const uint16_t sPort)
{
    struct addrinfo *lstAddr{}, hint{};
    hint.ai_family = AF_UNSPEC;
    hint.ai_socktype = SOCK_STREAM;
    hint.ai_flags = AI_PASSIVE;

    if (::getaddrinfo(szIpAddr, to_string(sPort).c_str(), &hint, &lstAddr) != 0)
        return false;

    bool bRet = true;

    try
    {
        for (auto curAddr = lstAddr; curAddr != nullptr; curAddr = curAddr->ai_next)
        {
            const SOCKET fd = ::socket(curAddr->ai_family, curAddr->ai_socktype, curAddr->ai_protocol);
            if (fd == INVALID_SOCKET)
                throw WSAGetLastError();

            m_vSock.push_back(fd);

            SetSocketOption(fd);

            if (curAddr->ai_family == AF_INET6)
            {
                constexpr uint32_t on = 1;
                if (::setsockopt(fd, IPPROTO_IPV6, IPV6_V6ONLY, reinterpret_cast<const char*>(&on), sizeof(on)) == -1)
                    throw WSAGetLastError();
            }

            if (::bind(fd, curAddr->ai_addr, static_cast<int>(curAddr->ai_addrlen)) < 0)
                throw WSAGetLastError();    // https://docs.microsoft.com/de-de/troubleshoot/windows-server/backup-and-storage/error-10013-wsaeacces-is-returned
        }                                   // netsh int ipv4 show excludedportrange protocol = tcp

        for (auto fSock : m_vSock)
        {
            if (::listen(fSock, SOMAXCONN) < 0)
                throw WSAGetLastError();
        }

        m_bStop = false;
        m_thListen = thread(&TcpServerImpl::SelectThread, this);
    }

    catch (const int iSocketErr)
    {
        m_iError = iSocketErr;
        m_iErrLoc = 1;
        Delete();
        bRet = false;
    }

    ::freeaddrinfo(lstAddr);

    return bRet;
}